

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_PermutationElement_Test::TestBody(Sampling_PermutationElement_Test *this)

{
  ulong uVar1;
  uint uVar2;
  uint32_t p;
  ulong __n;
  size_type sVar3;
  char *in_R9;
  size_type __n_00;
  reference rVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertionResult gtest_ar_;
  AssertHelper local_88;
  string local_80;
  size_type local_60;
  vector<bool,_std::allocator<bool>_> seen;
  
  __n_00 = 2;
  do {
    if (__n_00 == 0x400) {
      return;
    }
    for (p = 0; p != 10; p = p + 1) {
      local_80._M_dataplus._M_p._0_1_ = 0;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&seen,__n_00,(bool *)&local_80,(allocator_type *)&gtest_ar_);
      sVar3 = 0;
      while (__n_00 != sVar3) {
        local_60 = sVar3;
        uVar2 = pbrt::PermutationElement((uint32_t)sVar3,(uint32_t)__n_00,p);
        if ((int)uVar2 < 0) {
          gtest_ar_.success_ = false;
LAB_0037cfde:
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_a0);
          std::ostream::operator<<(local_a0.ptr_ + 0x10,uVar2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_80,(internal *)&gtest_ar_,
                     (AssertionResult *)"offset >= 0 && offset < seen.size()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x3e1,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                             local_80._M_dataplus._M_p._0_1_));
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          std::__cxx11::string::~string((string *)&local_80);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_a0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&seen.super__Bvector_base<std::allocator<bool>_>);
          return;
        }
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        __n = (ulong)uVar2;
        uVar1 = (ulong)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                ((long)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
        gtest_ar_.success_ = __n < uVar1;
        if (uVar1 <= __n) goto LAB_0037cfde;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&seen,__n);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_.success_ = (*rVar4._M_p & rVar4._M_mask) == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_80,(internal *)&gtest_ar_,(AssertionResult *)"seen[offset]","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x3e2,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                             local_80._M_dataplus._M_p._0_1_));
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          std::__cxx11::string::~string((string *)&local_80);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_a0);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&seen,__n);
        *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
        sVar3 = local_60 + 1;
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&seen.super__Bvector_base<std::allocator<bool>_>);
    }
    __n_00 = __n_00 + 1;
  } while( true );
}

Assistant:

TEST(Sampling, PermutationElement) {
    for (int len = 2; len < 1024; ++len) {
        for (int iter = 0; iter < 10; ++iter) {
            std::vector<bool> seen(len, false);

            for (int i = 0; i < len; ++i) {
                int offset = PermutationElement(i, len, iter);
                ASSERT_TRUE(offset >= 0 && offset < seen.size()) << offset;
                EXPECT_FALSE(seen[offset]);
                seen[offset] = true;
            }
        }
    }
}